

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_saver_exit_example.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  undefined8 extraout_RAX;
  int a;
  int local_1c;
  
  local_1c = 0;
  poVar1 = std::operator<<((ostream *)&std::cout,"main a = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0);
  std::endl<char,std::char_traits<char>>(poVar1);
  foo1(&local_1c);
  poVar1 = std::operator<<((ostream *)&std::cout,"main a = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1c);
  std::endl<char,std::char_traits<char>>(poVar1);
  foo2(&local_1c);
  __cxa_begin_catch(extraout_RAX);
  __cxa_end_catch();
  poVar1 = std::operator<<((ostream *)&std::cout,"main a = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1c);
  std::endl<char,std::char_traits<char>>(poVar1);
  foo3(&local_1c);
  poVar1 = std::operator<<((ostream *)&std::cout,"main a = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1c);
  std::endl<char,std::char_traits<char>>(poVar1);
  foo4(&local_1c);
  poVar1 = std::operator<<((ostream *)&std::cout,"main a = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1c);
  std::endl<char,std::char_traits<char>>(poVar1);
  foo5(&local_1c);
  poVar1 = std::operator<<((ostream *)&std::cout,"main a = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1c);
  std::endl<char,std::char_traits<char>>(poVar1);
  foo6(&local_1c);
  poVar1 = std::operator<<((ostream *)&std::cout,"main a = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1c);
  std::endl<char,std::char_traits<char>>(poVar1);
  return 0;
}

Assistant:

int main() {
  int a = 0;
  std::cout << "main a = " << a << std::endl;

  foo1(a);
  std::cout << "main a = " << a << std::endl;

  try {
    foo2(a);
  } catch (...) {}
  std::cout << "main a = " << a << std::endl;

  foo3(a);
  std::cout << "main a = " << a << std::endl;

  foo4(a);
  std::cout << "main a = " << a << std::endl;

  foo5(a);
  std::cout << "main a = " << a << std::endl;

  foo6(a);
  std::cout << "main a = " << a << std::endl;

  return 0;
}